

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool XML_ParserReset(XML_Parser parser,XML_Char *encodingName)

{
  NAMED **ppNVar1;
  tag *ptVar2;
  binding *pbVar3;
  open_internal_entity *poVar4;
  block *pbVar5;
  DTD *pDVar6;
  TAG *pTVar7;
  OPEN_INTERNAL_ENTITY *pOVar8;
  BINDING *pBVar9;
  NAMED *pNVar10;
  TAG *tag;
  OPEN_INTERNAL_ENTITY *pOVar11;
  BINDING *pBVar12;
  BLOCK *pBVar13;
  OPEN_INTERNAL_ENTITY *openEntity;
  BLOCK *pBVar14;
  TAG *pTVar15;
  NAMED **ppNVar16;
  ulong uVar17;
  
  if (parser == (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_parentParser != (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_tagStack != (TAG *)0x0) {
    ptVar2 = parser->m_tagStack;
    pTVar15 = parser->m_freeTagList;
    do {
      pTVar7 = ptVar2;
      ptVar2 = pTVar7->parent;
      pTVar7->parent = pTVar15;
      if (pTVar7->bindings != (BINDING *)0x0) {
        pbVar3 = pTVar7->bindings;
        pBVar12 = parser->m_freeBindingList;
        do {
          pBVar9 = pbVar3;
          pbVar3 = pBVar9->nextTagBinding;
          pBVar9->nextTagBinding = pBVar12;
          pBVar12 = pBVar9;
        } while (pbVar3 != (binding *)0x0);
        parser->m_freeBindingList = pBVar9;
      }
      pTVar7->bindings = (BINDING *)0x0;
      pTVar15 = pTVar7;
    } while (ptVar2 != (tag *)0x0);
    parser->m_freeTagList = pTVar7;
  }
  if (parser->m_openInternalEntities != (OPEN_INTERNAL_ENTITY *)0x0) {
    poVar4 = parser->m_openInternalEntities;
    pOVar11 = parser->m_freeInternalEntities;
    do {
      pOVar8 = poVar4;
      poVar4 = pOVar8->next;
      pOVar8->next = pOVar11;
      pOVar11 = pOVar8;
    } while (poVar4 != (open_internal_entity *)0x0);
    parser->m_freeInternalEntities = pOVar8;
  }
  if (parser->m_inheritedBindings != (BINDING *)0x0) {
    pbVar3 = parser->m_inheritedBindings;
    pBVar12 = parser->m_freeBindingList;
    do {
      pBVar9 = pbVar3;
      pbVar3 = pBVar9->nextTagBinding;
      pBVar9->nextTagBinding = pBVar12;
      pBVar12 = pBVar9;
    } while (pbVar3 != (binding *)0x0);
    parser->m_freeBindingList = pBVar9;
  }
  (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
    (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
  }
  pBVar14 = (parser->m_tempPool).blocks;
  pBVar13 = (parser->m_tempPool).freeBlocks;
  if (pBVar13 == (BLOCK *)0x0) {
LAB_0045663c:
    (parser->m_tempPool).freeBlocks = pBVar14;
  }
  else {
    pbVar5 = pBVar14;
    if (pBVar14 != (BLOCK *)0x0) {
      do {
        pBVar14 = pbVar5;
        pbVar5 = pBVar14->next;
        pBVar14->next = pBVar13;
        pBVar13 = pBVar14;
      } while (pbVar5 != (block *)0x0);
      goto LAB_0045663c;
    }
  }
  (parser->m_tempPool).blocks = (BLOCK *)0x0;
  (parser->m_tempPool).end = (XML_Char *)0x0;
  (parser->m_tempPool).ptr = (XML_Char *)0x0;
  (parser->m_tempPool).start = (XML_Char *)0x0;
  pBVar14 = (parser->m_temp2Pool).blocks;
  pBVar13 = (parser->m_temp2Pool).freeBlocks;
  if (pBVar13 != (BLOCK *)0x0) {
    pbVar5 = pBVar14;
    if (pBVar14 == (BLOCK *)0x0) goto LAB_00456692;
    do {
      pBVar14 = pbVar5;
      pbVar5 = pBVar14->next;
      pBVar14->next = pBVar13;
      pBVar13 = pBVar14;
    } while (pbVar5 != (block *)0x0);
  }
  (parser->m_temp2Pool).freeBlocks = pBVar14;
LAB_00456692:
  (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
  (parser->m_temp2Pool).end = (XML_Char *)0x0;
  (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
  (parser->m_temp2Pool).start = (XML_Char *)0x0;
  (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = (XML_Char *)0x0;
  parserInit(parser,encodingName);
  pDVar6 = parser->m_dtd;
  ppNVar16 = (pDVar6->elementTypes).v;
  ppNVar1 = ppNVar16 + (pDVar6->elementTypes).size;
LAB_004566dc:
  if (ppNVar16 != ppNVar1) goto code_r0x004566e1;
  pNVar10 = (NAMED *)0x0;
  goto LAB_004566f5;
code_r0x004566e1:
  pNVar10 = *ppNVar16;
  ppNVar16 = ppNVar16 + 1;
  if (pNVar10 == (NAMED *)0x0) goto LAB_004566dc;
LAB_004566f5:
  if (pNVar10 != (NAMED *)0x0) {
    if (*(int *)((long)&pNVar10[3].name + 4) != 0) {
      (*(parser->m_mem).free_fcn)(pNVar10[4].name);
    }
    goto LAB_004566dc;
  }
  if ((pDVar6->generalEntities).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar6->generalEntities).mem)->free_fcn)((pDVar6->generalEntities).v[uVar17]);
      (pDVar6->generalEntities).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar6->generalEntities).size);
  }
  (pDVar6->generalEntities).used = 0;
  if ((pDVar6->elementTypes).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar6->elementTypes).mem)->free_fcn)((pDVar6->elementTypes).v[uVar17]);
      (pDVar6->elementTypes).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar6->elementTypes).size);
  }
  (pDVar6->elementTypes).used = 0;
  if ((pDVar6->attributeIds).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar6->attributeIds).mem)->free_fcn)((pDVar6->attributeIds).v[uVar17]);
      (pDVar6->attributeIds).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar6->attributeIds).size);
  }
  (pDVar6->attributeIds).used = 0;
  if ((pDVar6->prefixes).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar6->prefixes).mem)->free_fcn)((pDVar6->prefixes).v[uVar17]);
      (pDVar6->prefixes).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar6->prefixes).size);
  }
  (pDVar6->prefixes).used = 0;
  pBVar14 = (pDVar6->pool).blocks;
  pBVar13 = (pDVar6->pool).freeBlocks;
  if (pBVar13 == (BLOCK *)0x0) {
LAB_00456819:
    (pDVar6->pool).freeBlocks = pBVar14;
  }
  else {
    pbVar5 = pBVar14;
    if (pBVar14 != (BLOCK *)0x0) {
      do {
        pBVar14 = pbVar5;
        pbVar5 = pBVar14->next;
        pBVar14->next = pBVar13;
        pBVar13 = pBVar14;
      } while (pbVar5 != (block *)0x0);
      goto LAB_00456819;
    }
  }
  (pDVar6->pool).blocks = (BLOCK *)0x0;
  (pDVar6->pool).end = (XML_Char *)0x0;
  (pDVar6->pool).ptr = (XML_Char *)0x0;
  (pDVar6->pool).start = (XML_Char *)0x0;
  pBVar14 = (pDVar6->entityValuePool).blocks;
  pBVar13 = (pDVar6->entityValuePool).freeBlocks;
  if (pBVar13 != (BLOCK *)0x0) {
    pbVar5 = pBVar14;
    if (pBVar14 == (BLOCK *)0x0) goto LAB_00456870;
    do {
      pBVar14 = pbVar5;
      pbVar5 = pBVar14->next;
      pBVar14->next = pBVar13;
      pBVar13 = pBVar14;
    } while (pbVar5 != (block *)0x0);
  }
  (pDVar6->entityValuePool).freeBlocks = pBVar14;
LAB_00456870:
  (pDVar6->entityValuePool).blocks = (BLOCK *)0x0;
  (pDVar6->entityValuePool).end = (XML_Char *)0x0;
  (pDVar6->entityValuePool).ptr = (XML_Char *)0x0;
  (pDVar6->entityValuePool).start = (XML_Char *)0x0;
  (pDVar6->defaultPrefix).name = (XML_Char *)0x0;
  (pDVar6->defaultPrefix).binding = (BINDING *)0x0;
  pDVar6->in_eldecl = '\0';
  (*(parser->m_mem).free_fcn)(pDVar6->scaffIndex);
  pDVar6->scaffIndex = (int *)0x0;
  (*(parser->m_mem).free_fcn)(pDVar6->scaffold);
  pDVar6->scaffCount = 0;
  pDVar6->scaffLevel = 0;
  pDVar6->scaffold = (CONTENT_SCAFFOLD *)0x0;
  pDVar6->contentStringLen = 0;
  pDVar6->scaffSize = 0;
  pDVar6->keepProcessing = '\x01';
  pDVar6->hasParamEntityRefs = '\0';
  pDVar6->standalone = '\0';
  return '\x01';
}

Assistant:

XML_Bool XMLCALL
XML_ParserReset(XML_Parser parser, const XML_Char *encodingName)
{
  TAG *tStk;
  OPEN_INTERNAL_ENTITY *openEntityList;

  if (parser == NULL)
      return XML_FALSE;

  if (parser->m_parentParser)
    return XML_FALSE;
  /* move m_tagStack to m_freeTagList */
  tStk = parser->m_tagStack;
  while (tStk) {
    TAG *tag = tStk;
    tStk = tStk->parent;
    tag->parent = parser->m_freeTagList;
    moveToFreeBindingList(parser, tag->bindings);
    tag->bindings = NULL;
    parser->m_freeTagList = tag;
  }
  /* move m_openInternalEntities to m_freeInternalEntities */
  openEntityList = parser->m_openInternalEntities;
  while (openEntityList) {
    OPEN_INTERNAL_ENTITY *openEntity = openEntityList;
    openEntityList = openEntity->next;
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }
  moveToFreeBindingList(parser, parser->m_inheritedBindings);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  poolClear(&parser->m_tempPool);
  poolClear(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = NULL;
  parserInit(parser, encodingName);
  dtdReset(parser->m_dtd, &parser->m_mem);
  return XML_TRUE;
}